

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

int fekete_suborder_num(int rule)

{
  ostream *poVar1;
  int local_10;
  int suborder_num;
  int rule_local;
  
  if (rule == 1) {
    local_10 = 3;
  }
  else if (rule == 2) {
    local_10 = 7;
  }
  else if (rule == 3) {
    local_10 = 0xc;
  }
  else if (rule == 4) {
    local_10 = 0x13;
  }
  else if (rule == 5) {
    local_10 = 0x15;
  }
  else if (rule == 6) {
    local_10 = 0x1c;
  }
  else {
    if (rule != 7) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"FEKETE_SUBORDER_NUM - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal RULE = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,rule);
      std::operator<<(poVar1,"\n");
      exit(1);
    }
    local_10 = 0x26;
  }
  return local_10;
}

Assistant:

int fekete_suborder_num ( int rule )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBORDER_NUM returns the number of suborders for a Fekete rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Output, int FEKETE_SUBORDER_NUM, the number of suborders of the rule.
//
{
  int suborder_num;

  if ( rule == 1 )
  {
    suborder_num = 3;
  }
  else if ( rule == 2 )
  {
    suborder_num = 7;
  }
  else if ( rule == 3 )
  {
    suborder_num = 12;
  }
  else if ( rule == 4 )
  {
    suborder_num = 19;
  }
  else if ( rule == 5 )
  {
    suborder_num = 21;
  }
  else if ( rule == 6 )
  {
    suborder_num = 28;
  }
  else if ( rule == 7 )
  {
    suborder_num = 38;
  }
  else
  {
    suborder_num = -1;
    std::cerr << "\n";
    std::cerr << "FEKETE_SUBORDER_NUM - Fatal error!\n";
    std::cerr << "  Illegal RULE = " << rule << "\n";
    exit ( 1 );
  }

  return suborder_num;
}